

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

bool __thiscall
Nova::Range<float,_2>::Intersection
          (Range<float,_2> *this,Range<float,_2> *box,float thickness_over_two)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  float *pfVar6;
  float local_18;
  float fStack_14;
  float afStack_10 [4];
  
  uVar3 = *(undefined8 *)(this->max_corner)._data._M_elems;
  local_18 = (this->min_corner)._data._M_elems[0] - thickness_over_two;
  fStack_14 = (this->min_corner)._data._M_elems[1] - thickness_over_two;
  afStack_10[0] = thickness_over_two + (float)uVar3;
  afStack_10[1] = thickness_over_two + (float)((ulong)uVar3 >> 0x20);
  bVar4 = true;
  lVar5 = 0;
  pfVar6 = &local_18;
  do {
    fVar1 = *pfVar6;
    fVar2 = (box->max_corner)._data._M_elems[lVar5];
    if (!bVar4) break;
    lVar5 = 1;
    bVar4 = false;
    pfVar6 = &fStack_14;
  } while (fVar1 <= fVar2);
  if (fVar2 < fVar1) {
    return false;
  }
  bVar4 = true;
  lVar5 = 0;
  do {
    fVar1 = afStack_10[lVar5];
    fVar2 = (box->min_corner)._data._M_elems[lVar5];
    if (!bVar4) {
      return fVar2 <= fVar1;
    }
    lVar5 = 1;
    bVar4 = false;
  } while (fVar2 <= fVar1);
  return fVar2 <= fVar1;
}

Assistant:

Vector(const Vector& other)
        :_data(other._data)
    {}